

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfdcore_address.cpp
# Opt level: O2

void __thiscall
cfd::core::Address::Address
          (Address *this,NetType_conflict type,WitnessVersion witness_ver,SchnorrPubkey *pubkey,
          string *bech32_hrp)

{
  NetType_conflict NVar1;
  CfdSourceLocation local_48;
  
  NVar1 = kCfdConnectionError;
  if (bech32_hrp->_M_string_length == 0) {
    NVar1 = type;
  }
  this->type_ = NVar1;
  this->addr_type_ = kTaprootAddress;
  this->witness_ver_ = witness_ver;
  ::std::__cxx11::string::string((string *)&this->address_,"",(allocator *)&local_48);
  ByteData::ByteData(&this->hash_);
  Pubkey::Pubkey(&this->pubkey_);
  ::std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)&this->schnorr_pubkey_,
             (vector<unsigned_char,_std::allocator<unsigned_char>_> *)pubkey);
  TaprootScriptTree::TaprootScriptTree(&this->script_tree_);
  Script::Script(&this->redeem_script_);
  AddressFormatData::AddressFormatData(&this->format_data_);
  this->checksum_[0] = '\0';
  this->checksum_[1] = '\0';
  this->checksum_[2] = '\0';
  this->checksum_[3] = '\0';
  CalculateTaproot(this,bech32_hrp);
  local_48.filename = "cfdcore_address.cpp";
  local_48.line = 0x22b;
  local_48.funcname = "Address";
  logger::info<cfd::core::NetType&,cfd::core::AddressType&,std::__cxx11::string_const&>
            (&local_48,"call Address({},{},{})",&this->type_,&this->addr_type_,bech32_hrp);
  return;
}

Assistant:

Address::Address(
    NetType type, WitnessVersion witness_ver, const SchnorrPubkey& pubkey,
    const std::string& bech32_hrp)
    : type_((!bech32_hrp.empty()) ? kCustomChain : type),
      addr_type_(AddressType::kTaprootAddress),
      witness_ver_(witness_ver),
      address_(""),
      hash_(),
      pubkey_(),
      schnorr_pubkey_(pubkey),
      redeem_script_() {
  memset(checksum_, 0, sizeof(checksum_));
  CalculateTaproot(bech32_hrp);
  info(
      CFD_LOG_SOURCE, "call Address({},{},{})", type_, addr_type_, bech32_hrp);
}